

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.h
# Opt level: O0

void __thiscall
miniros::Subscription::PendingConnection::~PendingConnection(PendingConnection *this)

{
  PendingConnection *in_RDI;
  
  ~PendingConnection(in_RDI);
  operator_delete(in_RDI,0x60);
  return;
}

Assistant:

~PendingConnection()
      {
        delete client_;
      }